

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O3

qsizetype __thiscall QTextBoundaryFinder::toPreviousBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  pQVar1 = this->attributes;
  if (((pQVar1 != (QCharAttributes *)0x0) && (uVar2 = this->pos, 0 < (long)uVar2)) &&
     ((long)uVar2 <= (this->sv).m_size)) {
    lVar5 = uVar2 - 1;
    this->pos = lVar5;
    switch(this->t) {
    case Grapheme:
      if (uVar2 < 2) {
        return 0;
      }
      do {
        if (((byte)pQVar1[lVar5] & 1) != 0) {
          return lVar5;
        }
        lVar4 = lVar5 + -1;
        this->pos = lVar4;
        bVar3 = 1 < lVar5;
        lVar5 = lVar4;
      } while (bVar3);
      break;
    case Word:
      if (uVar2 < 2) {
        return 0;
      }
      do {
        if (((byte)pQVar1[lVar5] & 2) != 0) {
          return lVar5;
        }
        lVar4 = lVar5 + -1;
        this->pos = lVar4;
        bVar3 = 1 < lVar5;
        lVar5 = lVar4;
      } while (bVar3);
      break;
    case Sentence:
      if (uVar2 < 2) {
        return 0;
      }
      do {
        if (((byte)pQVar1[lVar5] & 4) != 0) {
          return lVar5;
        }
        lVar4 = lVar5 + -1;
        this->pos = lVar4;
        bVar3 = 1 < lVar5;
        lVar5 = lVar4;
      } while (bVar3);
      break;
    case Line:
      if (uVar2 < 2) {
        return 0;
      }
      do {
        if (((byte)pQVar1[lVar5] & 8) != 0) {
          return lVar5;
        }
        lVar4 = lVar5 + -1;
        this->pos = lVar4;
        bVar3 = 1 < lVar5;
        lVar5 = lVar4;
      } while (bVar3);
      break;
    default:
      return lVar5;
    }
    return lVar4;
  }
  this->pos = -1;
  return -1;
}

Assistant:

qsizetype QTextBoundaryFinder::toPreviousBoundary()
{
    if (!attributes || pos <= 0 || pos > sv.size()) {
        pos = -1;
        return pos;
    }

    --pos;
    switch(t) {
    case Grapheme:
        while (pos > 0 && !attributes[pos].graphemeBoundary)
            --pos;
        break;
    case Word:
        while (pos > 0 && !attributes[pos].wordBreak)
            --pos;
        break;
    case Sentence:
        while (pos > 0 && !attributes[pos].sentenceBoundary)
            --pos;
        break;
    case Line:
        while (pos > 0 && !attributes[pos].lineBreak)
            --pos;
        break;
    }

    return pos;
}